

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O0

bool ncnn::test_prefer_winograd23(int num_input,int num_output,int w,int h)

{
  int iVar1;
  int *piVar2;
  int in_ESI;
  int in_EDI;
  int minwh;
  bool local_53;
  bool local_52;
  bool local_51;
  bool local_50;
  bool local_4f;
  bool local_4e;
  bool local_4d;
  bool local_4c;
  bool local_4b;
  bool local_4a;
  bool local_49;
  bool local_48;
  bool local_47;
  bool local_46;
  bool local_45;
  bool local_44;
  bool local_43;
  bool local_42;
  bool local_41;
  bool local_40;
  bool local_3f;
  bool local_3e;
  bool local_3d;
  bool local_3c;
  bool local_3b;
  bool local_3a;
  bool local_39;
  bool local_38;
  bool local_37;
  bool local_36;
  bool local_35;
  bool local_34;
  bool local_33;
  bool local_32;
  bool local_31;
  bool local_30;
  bool local_2f;
  bool local_2e;
  bool local_2d;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  bool local_28;
  bool local_27;
  bool local_26;
  bool local_25;
  bool local_24;
  bool local_23;
  bool local_22;
  bool local_21;
  bool local_20;
  bool local_1f;
  bool local_1e;
  bool local_1d;
  bool local_1c;
  bool local_1b;
  bool local_1a;
  bool local_19;
  int local_14;
  int local_10;
  int local_c;
  int local_8;
  bool local_1;
  
  local_c = in_ESI;
  local_8 = in_EDI;
  piVar2 = std::min<int>(&local_10,&local_14);
  iVar1 = *piVar2;
  if (local_8 < 0x200) {
    if (local_8 < 0x100) {
      if (local_8 < 0x80) {
        if (local_8 < 0x40) {
          if (local_8 < 0x20) {
            if (local_8 < 0x10) {
              if (local_8 < 8) {
                local_1 = false;
              }
              else if (local_c < 0x80) {
                if (local_c < 0x40) {
                  if (local_c < 0x20) {
                    if (local_c < 0x10) {
                      if (local_c < 8) {
                        local_1 = false;
                      }
                      else {
                        local_1 = true;
                      }
                    }
                    else {
                      if (((iVar1 < 3) || (local_52 = true, 6 < iVar1)) &&
                         ((iVar1 < 9 || (local_52 = true, 0xe < iVar1)))) {
                        local_53 = 0x2e < iVar1 && iVar1 < 0xd5;
                        local_52 = local_53;
                      }
                      local_1 = local_52;
                    }
                  }
                  else {
                    if ((iVar1 < 3) || (local_50 = true, 6 < iVar1)) {
                      local_51 = 0xe < iVar1 && iVar1 < 0x11;
                      local_50 = local_51;
                    }
                    local_1 = local_50;
                  }
                }
                else {
                  if (((iVar1 < 3) || (local_4e = true, 4 < iVar1)) &&
                     ((iVar1 < 7 || (local_4e = true, 0xe < iVar1)))) {
                    local_4f = 0x2e < iVar1 && iVar1 < 0x31;
                    local_4e = local_4f;
                  }
                  local_1 = local_4e;
                }
              }
              else {
                local_1 = false;
              }
            }
            else if (local_c < 0x200) {
              if (local_c < 0x100) {
                if (local_c < 0x80) {
                  if (local_c < 0x40) {
                    if (local_c < 0x20) {
                      if (local_c < 0x10) {
                        if (local_c < 8) {
                          local_1 = false;
                        }
                        else {
                          if ((iVar1 < 3) || (local_4c = true, 8 < iVar1)) {
                            local_4d = 10 < iVar1 && iVar1 < 0xd;
                            local_4c = local_4d;
                          }
                          local_1 = local_4c;
                        }
                      }
                      else {
                        local_4b = 2 < iVar1 && iVar1 < 0xb;
                        local_1 = local_4b;
                      }
                    }
                    else {
                      if ((iVar1 < 3) || (local_49 = true, 4 < iVar1)) {
                        local_4a = 8 < iVar1 && iVar1 < 0xb;
                        local_49 = local_4a;
                      }
                      local_1 = local_49;
                    }
                  }
                  else {
                    if ((((iVar1 < 3) || (local_47 = true, 4 < iVar1)) &&
                        ((iVar1 < 7 || (local_47 = true, 8 < iVar1)))) &&
                       ((iVar1 < 0xb || (local_47 = true, 0xc < iVar1)))) {
                      local_48 = 0xe < iVar1 && iVar1 < 0x13;
                      local_47 = local_48;
                    }
                    local_1 = local_47;
                  }
                }
                else {
                  if ((iVar1 < 3) || (local_45 = true, 6 < iVar1)) {
                    local_46 = 8 < iVar1 && iVar1 < 0x13;
                    local_45 = local_46;
                  }
                  local_1 = local_45;
                }
              }
              else {
                local_44 = 2 < iVar1 && iVar1 < 0xd;
                local_1 = local_44;
              }
            }
            else {
              local_43 = 10 < iVar1 && iVar1 < 0xd;
              local_1 = local_43;
            }
          }
          else if (local_c < 0x200) {
            if (local_c < 0x100) {
              if (local_c < 0x80) {
                if (local_c < 0x40) {
                  if (local_c < 0x20) {
                    if (local_c < 0x10) {
                      if (local_c < 8) {
                        local_1 = false;
                      }
                      else {
                        local_42 = 2 < iVar1 && iVar1 < 0xb;
                        local_1 = local_42;
                      }
                    }
                    else {
                      local_41 = 6 < iVar1 && iVar1 < 9;
                      local_1 = local_41;
                    }
                  }
                  else {
                    local_40 = 6 < iVar1 && iVar1 < 9;
                    local_1 = local_40;
                  }
                }
                else {
                  local_3f = 2 < iVar1 && iVar1 < 9;
                  local_1 = local_3f;
                }
              }
              else {
                if ((iVar1 < 3) || (local_3d = true, 4 < iVar1)) {
                  local_3e = 6 < iVar1 && iVar1 < 0x11;
                  local_3d = local_3e;
                }
                local_1 = local_3d;
              }
            }
            else {
              if ((iVar1 < 3) || (local_3b = true, 6 < iVar1)) {
                local_3c = 10 < iVar1 && iVar1 < 0xd;
                local_3b = local_3c;
              }
              local_1 = local_3b;
            }
          }
          else {
            if ((iVar1 < 3) || (local_39 = true, 6 < iVar1)) {
              local_3a = 10 < iVar1 && iVar1 < 0xd;
              local_39 = local_3a;
            }
            local_1 = local_39;
          }
        }
        else if (local_c < 0x200) {
          if (local_c < 0x100) {
            if (local_c < 0x80) {
              if (local_c < 0x40) {
                if (local_c < 0x20) {
                  if (local_c < 0x10) {
                    if (local_c < 8) {
                      local_1 = false;
                    }
                    else {
                      local_38 = 2 < iVar1 && iVar1 < 0xd;
                      local_1 = local_38;
                    }
                  }
                  else {
                    local_37 = 2 < iVar1 && iVar1 < 0xd;
                    local_1 = local_37;
                  }
                }
                else {
                  local_36 = 2 < iVar1 && iVar1 < 0xd;
                  local_1 = local_36;
                }
              }
              else {
                local_35 = 2 < iVar1 && iVar1 < 0xd;
                local_1 = local_35;
              }
            }
            else {
              if ((iVar1 < 3) || (local_33 = true, 8 < iVar1)) {
                local_34 = 0x12 < iVar1 && iVar1 < 0x17;
                local_33 = local_34;
              }
              local_1 = local_33;
            }
          }
          else {
            local_32 = 6 < iVar1 && iVar1 < 9;
            local_1 = local_32;
          }
        }
        else {
          if (((iVar1 < 3) || (local_30 = true, 8 < iVar1)) &&
             ((iVar1 < 0xb || (local_30 = true, 0xc < iVar1)))) {
            local_31 = 0xe < iVar1 && iVar1 < 0x15;
            local_30 = local_31;
          }
          local_1 = local_30;
        }
      }
      else if (local_c < 0x200) {
        if (local_c < 0x100) {
          if (local_c < 0x80) {
            if (local_c < 0x40) {
              if (local_c < 0x20) {
                if (local_c < 0x10) {
                  if (local_c < 8) {
                    local_1 = false;
                  }
                  else {
                    local_2f = 2 < iVar1 && iVar1 < 7;
                    local_1 = local_2f;
                  }
                }
                else {
                  local_2e = 2 < iVar1 && iVar1 < 7;
                  local_1 = local_2e;
                }
              }
              else {
                local_2d = 2 < iVar1 && iVar1 < 0xb;
                local_1 = local_2d;
              }
            }
            else {
              local_2c = 2 < iVar1 && iVar1 < 9;
              local_1 = local_2c;
            }
          }
          else {
            local_2b = 2 < iVar1 && iVar1 < 0xb;
            local_1 = local_2b;
          }
        }
        else {
          if ((iVar1 < 3) || (local_29 = true, 8 < iVar1)) {
            local_2a = 10 < iVar1 && iVar1 < 0xd;
            local_29 = local_2a;
          }
          local_1 = local_29;
        }
      }
      else {
        local_28 = 2 < iVar1 && iVar1 < 0xf;
        local_1 = local_28;
      }
    }
    else if (local_c < 0x200) {
      if (local_c < 0x100) {
        if (local_c < 0x80) {
          if (local_c < 0x40) {
            if (local_c < 0x20) {
              if (local_c < 0x10) {
                if (local_c < 8) {
                  local_1 = false;
                }
                else {
                  local_27 = 2 < iVar1 && iVar1 < 7;
                  local_1 = local_27;
                }
              }
              else {
                local_26 = 2 < iVar1 && iVar1 < 9;
                local_1 = local_26;
              }
            }
            else {
              local_25 = 2 < iVar1 && iVar1 < 9;
              local_1 = local_25;
            }
          }
          else {
            local_24 = 2 < iVar1 && iVar1 < 5;
            local_1 = local_24;
          }
        }
        else {
          local_23 = 2 < iVar1 && iVar1 < 0xd;
          local_1 = local_23;
        }
      }
      else {
        local_22 = 2 < iVar1 && iVar1 < 0xf;
        local_1 = local_22;
      }
    }
    else {
      local_21 = 2 < iVar1 && iVar1 < 0xf;
      local_1 = local_21;
    }
  }
  else if (local_c < 0x200) {
    if (local_c < 0x100) {
      if (local_c < 0x80) {
        if (local_c < 0x40) {
          if (local_c < 0x20) {
            if (local_c < 0x10) {
              if (local_c < 8) {
                local_1 = false;
              }
              else {
                local_20 = 2 < iVar1 && iVar1 < 7;
                local_1 = local_20;
              }
            }
            else {
              local_1f = 2 < iVar1 && iVar1 < 9;
              local_1 = local_1f;
            }
          }
          else {
            local_1e = 2 < iVar1 && iVar1 < 9;
            local_1 = local_1e;
          }
        }
        else {
          if ((iVar1 < 3) || (local_1c = true, 8 < iVar1)) {
            local_1d = 10 < iVar1 && iVar1 < 0xd;
            local_1c = local_1d;
          }
          local_1 = local_1c;
        }
      }
      else {
        local_1b = 2 < iVar1 && iVar1 < 0xf;
        local_1 = local_1b;
      }
    }
    else {
      local_1a = 2 < iVar1 && iVar1 < 0xf;
      local_1 = local_1a;
    }
  }
  else {
    local_19 = 2 < iVar1 && iVar1 < 0xf;
    local_1 = local_19;
  }
  return local_1;
}

Assistant:

static bool test_prefer_winograd23(int num_input, int num_output, int w, int h)
{
    int minwh = std::min(w, h);

    if (num_input >= 512)
    {
        if (num_output >= 512) return (minwh >= 3 && minwh <= 14);
        if (num_output >= 256) return (minwh >= 3 && minwh <= 14);
        if (num_output >= 128) return (minwh >= 3 && minwh <= 14);
        if (num_output >= 64) return (minwh >= 3 && minwh <= 8) || (minwh >= 11 && minwh <= 12);
        if (num_output >= 32) return (minwh >= 3 && minwh <= 8);
        if (num_output >= 16) return (minwh >= 3 && minwh <= 8);
        if (num_output >= 8) return (minwh >= 3 && minwh <= 6);
        return false;
    }
    if (num_input >= 256)
    {
        if (num_output >= 512) return (minwh >= 3 && minwh <= 14);
        if (num_output >= 256) return (minwh >= 3 && minwh <= 14);
        if (num_output >= 128) return (minwh >= 3 && minwh <= 12);
        if (num_output >= 64) return (minwh >= 3 && minwh <= 4);
        if (num_output >= 32) return (minwh >= 3 && minwh <= 8);
        if (num_output >= 16) return (minwh >= 3 && minwh <= 8);
        if (num_output >= 8) return (minwh >= 3 && minwh <= 6);
        return false;
    }
    if (num_input >= 128)
    {
        if (num_output >= 512) return (minwh >= 3 && minwh <= 14);
        if (num_output >= 256) return (minwh >= 3 && minwh <= 8) || (minwh >= 11 && minwh <= 12);
        if (num_output >= 128) return (minwh >= 3 && minwh <= 10);
        if (num_output >= 64) return (minwh >= 3 && minwh <= 8);
        if (num_output >= 32) return (minwh >= 3 && minwh <= 10);
        if (num_output >= 16) return (minwh >= 3 && minwh <= 6);
        if (num_output >= 8) return (minwh >= 3 && minwh <= 6);
        return false;
    }
    if (num_input >= 64)
    {
        if (num_output >= 512) return (minwh >= 3 && minwh <= 8) || (minwh >= 11 && minwh <= 12) || (minwh >= 15 && minwh <= 20);
        if (num_output >= 256) return (minwh >= 7 && minwh <= 8);
        if (num_output >= 128) return (minwh >= 3 && minwh <= 8) || (minwh >= 19 && minwh <= 22);
        if (num_output >= 64) return (minwh >= 3 && minwh <= 12);
        if (num_output >= 32) return (minwh >= 3 && minwh <= 12);
        if (num_output >= 16) return (minwh >= 3 && minwh <= 12);
        if (num_output >= 8) return (minwh >= 3 && minwh <= 12);
        return false;
    }
    if (num_input >= 32)
    {
        if (num_output >= 512) return (minwh >= 3 && minwh <= 6) || (minwh >= 11 && minwh <= 12);
        if (num_output >= 256) return (minwh >= 3 && minwh <= 6) || (minwh >= 11 && minwh <= 12);
        if (num_output >= 128) return (minwh >= 3 && minwh <= 4) || (minwh >= 7 && minwh <= 16);
        if (num_output >= 64) return (minwh >= 3 && minwh <= 8);
        if (num_output >= 32) return (minwh >= 7 && minwh <= 8);
        if (num_output >= 16) return (minwh >= 7 && minwh <= 8);
        if (num_output >= 8) return (minwh >= 3 && minwh <= 10);
        return false;
    }
    if (num_input >= 16)
    {
        if (num_output >= 512) return (minwh >= 11 && minwh <= 12);
        if (num_output >= 256) return (minwh >= 3 && minwh <= 12);
        if (num_output >= 128) return (minwh >= 3 && minwh <= 6)
                                          || (minwh >= 9 && minwh <= 18);
        if (num_output >= 64) return (minwh >= 3 && minwh <= 4)
                                         || (minwh >= 7 && minwh <= 8)
                                         || (minwh >= 11 && minwh <= 12)
                                         || (minwh >= 15 && minwh <= 18);
        if (num_output >= 32) return (minwh >= 3 && minwh <= 4)
                                         || (minwh >= 9 && minwh <= 10);
        if (num_output >= 16) return (minwh >= 3 && minwh <= 10);
        if (num_output >= 8) return (minwh >= 3 && minwh <= 8)
                                        || (minwh >= 11 && minwh <= 12);
        return false;
    }
    if (num_input >= 8)
    {
        if (num_output >= 128) return false;
        if (num_output >= 64) return (minwh >= 3 && minwh <= 4)
                                         || (minwh >= 7 && minwh <= 14)
                                         || (minwh >= 47 && minwh <= 48);
        if (num_output >= 32) return (minwh >= 3 && minwh <= 6)
                                         || (minwh >= 15 && minwh <= 16);
        if (num_output >= 16) return (minwh >= 3 && minwh <= 6)
                                         || (minwh >= 9 && minwh <= 14)
                                         || (minwh >= 47 && minwh <= 212);
        if (num_output >= 8) return true;
        return false;
    }

    return false;
}